

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_true>::push_block_
          (DaTrie<true,_true,_true> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  pointer pBVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = block_pos * 0x100;
  *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start + (uVar6 + 0xff)) = uVar6 & 0x7fffff00;
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3[uVar6] =
       (Bc)((ulong)pBVar3[uVar6] & 0x80000000ffffffff | (ulong)(uVar6 + 0xff & 0x7fffffff) << 0x20);
  pBVar4 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = pBVar4 + block_pos;
  pBVar4[block_pos].head = uVar6;
  uVar6 = this->head_pos_;
  uVar5 = (ulong)uVar6;
  if (uVar5 != 0xffffffff) {
    uVar2 = pBVar4[uVar5].prev;
    pBVar1->prev = uVar2;
    pBVar1->next = uVar6;
    pBVar4[uVar2].next = block_pos;
    pBVar4[uVar5].prev = block_pos;
    return;
  }
  pBVar1->next = block_pos;
  pBVar1->prev = block_pos;
  this->head_pos_ = block_pos;
  return;
}

Assistant:

void push_block_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;
    set_next_(end - 1, begin);
    set_prev_(begin, end - 1);

    blocks[block_pos].head = begin;
    insert_block_link_(block_pos, blocks);
  }